

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageAtomicOperationTests.cpp
# Opt level: O2

void __thiscall
vkt::image::anon_unknown_2::BinaryAtomicIntermValuesInstance::prepareResources
          (BinaryAtomicIntermValuesInstance *this)

{
  UVec3 *imageSize;
  TextureFormat *format;
  ImageType imageType;
  VkImage image;
  uint uVar1;
  PtrData<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> data;
  VkImageSubresourceRange subresourceRange;
  deUint32 dVar2;
  VkImageViewType imageViewType;
  VkFormat format_00;
  VkDevice device;
  DeviceInterface *vk;
  Allocator *allocator;
  Image *this_00;
  undefined8 uVar3;
  bool bVar4;
  Image *in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  undefined1 local_f8 [16];
  VkDevice local_e8;
  VkAllocationCallbacks *pVStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  deUint32 local_c8;
  RefBase<vk::Handle<(vk::HandleType)13>_> local_b8;
  UVec3 layerSize;
  VkImageCreateInfo local_88;
  
  device = Context::getDevice((this->super_BinaryAtomicInstanceBase).super_TestInstance.m_context);
  vk = Context::getDeviceInterface
                 ((this->super_BinaryAtomicInstanceBase).super_TestInstance.m_context);
  allocator = Context::getDefaultAllocator
                        ((this->super_BinaryAtomicInstanceBase).super_TestInstance.m_context);
  imageSize = &(this->super_BinaryAtomicInstanceBase).m_imageSize;
  getLayerSize((this->super_BinaryAtomicInstanceBase).m_imageType,imageSize);
  imageType = (this->super_BinaryAtomicInstanceBase).m_imageType;
  bVar4 = imageType - IMAGE_TYPE_CUBE < 2;
  uVar1 = layerSize.m_data[1] * 5;
  if (!bVar4) {
    uVar1 = layerSize.m_data[1];
  }
  local_88.flags = (uint)bVar4 << 4;
  uVar3._4_4_ = uVar1;
  uVar3._0_4_ = layerSize.m_data[0] * 5;
  local_88.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  local_88.pNext = (void *)0x0;
  local_88.imageType = mapImageType(imageType);
  format = &(this->super_BinaryAtomicInstanceBase).m_format;
  local_88.format = ::vk::mapTextureFormat(format);
  local_88.extent.depth = layerSize.m_data[2];
  local_88.mipLevels = 1;
  local_88.extent._0_8_ = uVar3;
  local_88.arrayLayers = getNumLayers((this->super_BinaryAtomicInstanceBase).m_imageType,imageSize);
  local_88.samples = VK_SAMPLE_COUNT_1_BIT;
  local_88.tiling = VK_IMAGE_TILING_OPTIMAL;
  local_88.usage = 9;
  local_88.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  local_88.queueFamilyIndexCount = 0;
  local_88.pQueueFamilyIndices = (deUint32 *)0x0;
  local_88.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  this_00 = (Image *)operator_new(0x30);
  Image::Image(this_00,vk,device,allocator,&local_88,(MemoryRequirement)0x0);
  local_f8._0_8_ = (Image *)0x0;
  data._8_8_ = in_stack_fffffffffffffee0;
  data.ptr = in_stack_fffffffffffffed8;
  de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::assignData
            (&(this->m_intermResultsImage).
              super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>,data);
  de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::~UniqueBase
            ((UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> *)local_f8);
  dVar2 = getNumLayers((this->super_BinaryAtomicInstanceBase).m_imageType,imageSize);
  image.m_internal =
       (((this->m_intermResultsImage).
         super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>.m_data.ptr)->
       m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  imageViewType = mapImageViewType((this->super_BinaryAtomicInstanceBase).m_imageType);
  format_00 = ::vk::mapTextureFormat(format);
  local_d8 = 1;
  uStack_d0 = 1;
  subresourceRange.levelCount = 1;
  subresourceRange.baseArrayLayer = 0;
  subresourceRange.aspectMask = 1;
  subresourceRange.baseMipLevel = 0;
  subresourceRange.layerCount = dVar2;
  local_c8 = dVar2;
  makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&local_b8,vk,device,image,imageViewType,
                format_00,subresourceRange);
  local_e8 = local_b8.m_data.deleter.m_device;
  pVStack_e0 = local_b8.m_data.deleter.m_allocator;
  local_f8._0_8_ = local_b8.m_data.object.m_internal;
  local_f8._8_8_ = local_b8.m_data.deleter.m_deviceIface;
  local_b8.m_data.object.m_internal = 0;
  local_b8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_b8.m_data.deleter.m_device = (VkDevice)0x0;
  local_b8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::reset
            (&(this->m_intermResultsImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>);
  (this->m_intermResultsImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_device = local_e8;
  (this->m_intermResultsImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_allocator = pVStack_e0;
  (this->m_intermResultsImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
  m_internal = local_f8._0_8_;
  (this->m_intermResultsImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)local_f8._8_8_;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase(&local_b8);
  return;
}

Assistant:

void BinaryAtomicIntermValuesInstance::prepareResources (void)
{
	const VkDevice			device			= m_context.getDevice();
	const DeviceInterface&	deviceInterface = m_context.getDeviceInterface();
	Allocator&				allocator		= m_context.getDefaultAllocator();

	const UVec3 layerSize			= getLayerSize(m_imageType, m_imageSize);
	const bool  isCubeBasedImage	= (m_imageType == IMAGE_TYPE_CUBE || m_imageType == IMAGE_TYPE_CUBE_ARRAY);
	const UVec3 extendedLayerSize	= isCubeBasedImage	? UVec3(NUM_INVOCATIONS_PER_PIXEL * layerSize.x(), NUM_INVOCATIONS_PER_PIXEL * layerSize.y(), layerSize.z())
														: UVec3(NUM_INVOCATIONS_PER_PIXEL * layerSize.x(), layerSize.y(), layerSize.z());

	const VkImageCreateInfo imageParams =
	{
		VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,		// VkStructureType			sType;
		DE_NULL,									// const void*				pNext;
		(m_imageType == IMAGE_TYPE_CUBE ||
		 m_imageType == IMAGE_TYPE_CUBE_ARRAY ?
		 (VkImageCreateFlags)VK_IMAGE_CREATE_CUBE_COMPATIBLE_BIT :
		 (VkImageCreateFlags)0u),					// VkImageCreateFlags		flags;
		mapImageType(m_imageType),					// VkImageType				imageType;
		mapTextureFormat(m_format),					// VkFormat					format;
		makeExtent3D(extendedLayerSize),			// VkExtent3D				extent;
		1u,											// deUint32					mipLevels;
		getNumLayers(m_imageType, m_imageSize),		// deUint32					arrayLayers;
		VK_SAMPLE_COUNT_1_BIT,						// VkSampleCountFlagBits	samples;
		VK_IMAGE_TILING_OPTIMAL,					// VkImageTiling			tiling;
		VK_IMAGE_USAGE_STORAGE_BIT |
		VK_IMAGE_USAGE_TRANSFER_SRC_BIT,
		VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode			sharingMode;
		0u,											// deUint32					queueFamilyIndexCount;
		DE_NULL,									// const deUint32*			pQueueFamilyIndices;
		VK_IMAGE_LAYOUT_UNDEFINED,					// VkImageLayout			initialLayout;
	};

	m_intermResultsImage = de::MovePtr<Image>(new Image(deviceInterface, device, allocator, imageParams, MemoryRequirement::Any));

	const VkImageSubresourceRange subresourceRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, getNumLayers(m_imageType, m_imageSize));

	m_intermResultsImageView = makeImageView(deviceInterface, device, m_intermResultsImage->get(), mapImageViewType(m_imageType), mapTextureFormat(m_format), subresourceRange);
}